

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void add_obj_and_parts(Am_Object *orig,Am_Value_List *new_parts,int *maxobjw,int *maxobjh)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Method_Wrapper *pAVar3;
  Am_Method_Wrapper *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Object local_b0;
  undefined1 local_a8 [8];
  Am_Value_List parts;
  Am_Object local_88;
  Am_Object sub_obj;
  int wh;
  Am_Object local_60;
  Am_Object new_obj;
  Am_Draw_Method fade_method;
  Am_Draw_Method agg_method;
  Am_Draw_Method method;
  int *maxobjh_local;
  int *maxobjw_local;
  Am_Value_List *new_parts_local;
  Am_Object *orig_local;
  
  pAVar2 = Am_Object::Get(orig,2000,0);
  Am_Draw_Method::Am_Draw_Method((Am_Draw_Method *)&agg_method.Call,pAVar2);
  pAVar2 = Am_Object::Get(&Am_Aggregate,2000,0);
  Am_Draw_Method::Am_Draw_Method((Am_Draw_Method *)&fade_method.Call,pAVar2);
  pAVar2 = Am_Object::Get(&Am_Fade_Group,2000,0);
  Am_Draw_Method::Am_Draw_Method((Am_Draw_Method *)&new_obj,pAVar2);
  Am_Object::Am_Object(&local_60);
  pAVar3 = Am_Draw_Method::operator_cast_to_Am_Method_Wrapper_((Am_Draw_Method *)&agg_method.Call);
  pAVar4 = Am_Draw_Method::operator_cast_to_Am_Method_Wrapper_((Am_Draw_Method *)&fade_method.Call);
  if (pAVar3 != pAVar4) {
    pAVar3 = Am_Draw_Method::operator_cast_to_Am_Method_Wrapper_((Am_Draw_Method *)&agg_method.Call)
    ;
    pAVar4 = Am_Draw_Method::operator_cast_to_Am_Method_Wrapper_((Am_Draw_Method *)&new_obj);
    if (pAVar3 != pAVar4) {
      Am_Object::Copy_Value_Only((Am_Object *)&stack0xffffffffffffff88,(char *)orig);
      Am_Object::operator=(&local_60,(Am_Object *)&stack0xffffffffffffff88);
      Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff88);
      pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
      Am_Value_List::Add(new_parts,pAVar5,Am_TAIL,true);
      pAVar2 = Am_Object::Get(orig,0x66,0);
      sub_obj.data._4_4_ = Am_Value::operator_cast_to_int(pAVar2);
      if (*maxobjw < sub_obj.data._4_4_) {
        *maxobjw = sub_obj.data._4_4_;
      }
      pAVar2 = Am_Object::Get(orig,0x67,0);
      sub_obj.data._4_4_ = Am_Value::operator_cast_to_int(pAVar2);
      if (*maxobjh < sub_obj.data._4_4_) {
        *maxobjh = sub_obj.data._4_4_;
      }
    }
  }
  Am_Object::Am_Object(&local_88);
  bVar1 = Am_Is_Group_Or_Map(orig);
  if (bVar1) {
    bVar1 = Am_Object::Valid(&local_60);
    if (bVar1) {
      Am_Value_List::Am_Value_List((Am_Value_List *)&parts.item);
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&parts.item);
      Am_Object::Set(&local_60,0x82,pAVar5,0);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&parts.item);
    }
    pAVar2 = Am_Object::Get(orig,0x82,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_a8,pAVar2);
    Am_Value_List::Start((Am_Value_List *)local_a8);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_a8), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar2 = Am_Value_List::Get((Am_Value_List *)local_a8);
      Am_Object::operator=(&local_88,pAVar2);
      Am_Object::Am_Object(&local_b0,&Am_Graphical_Object);
      bVar1 = Am_Object::Is_Instance_Of(&local_88,&local_b0);
      Am_Object::~Am_Object(&local_b0);
      if (bVar1) {
        add_obj_and_parts(&local_88,new_parts,maxobjw,maxobjh);
      }
      Am_Value_List::Next((Am_Value_List *)local_a8);
    }
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_a8);
  }
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_60);
  return;
}

Assistant:

void
add_obj_and_parts(Am_Object &orig, Am_Value_List &new_parts, int &maxobjw,
                  int &maxobjh)
{
  //don't add parts that use the regular aggregate draw method, since
  //it draws all subparts anyway.  This includes regular Maps and Groups
  Am_Draw_Method method = orig.Get(Am_DRAW_METHOD);
  Am_Draw_Method agg_method = Am_Aggregate.Get(Am_DRAW_METHOD);
  Am_Draw_Method fade_method = Am_Fade_Group.Get(Am_DRAW_METHOD);
  Am_Object new_obj;
  if (method != agg_method && method != fade_method) {
    new_obj = orig.Copy_Value_Only();
    new_parts.Add(new_obj);
    int wh = orig.Get(Am_WIDTH);
    if (wh > maxobjw)
      maxobjw = wh;
    wh = orig.Get(Am_HEIGHT);
    if (wh > maxobjh)
      maxobjh = wh;
  }
  Am_Object sub_obj;
  if (Am_Is_Group_Or_Map(orig)) {
    //flatten out the parts
    //can't use graphical_parts list because it is computed by a
    //constraint which has been removed
    if (new_obj.Valid())
      new_obj.Set(Am_GRAPHICAL_PARTS, Am_Value_List()); //make it empty in copy
    Am_Value_List parts = orig.Get(Am_GRAPHICAL_PARTS);
    for (parts.Start(); !parts.Last(); parts.Next()) {
      sub_obj = parts.Get();
      if (sub_obj.Is_Instance_Of(Am_Graphical_Object))
        add_obj_and_parts(sub_obj, new_parts, maxobjw, maxobjh);
    }
  }
}